

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O3

void AI::setupPredicates(TaskDatabase *tasks)

{
  vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_> *this;
  SatisfiablePredicate local_38;
  
  this = &tasks->satisfiablePredicates;
  local_38.identifier = NearPlayer;
  local_38.func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_38.func.super__Function_base._M_functor._8_8_ = 0;
  local_38.func._M_invoker =
       std::
       _Function_handler<bool_(const_AI::WorldState_&,_const_AI::Task_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:1249:4)>
       ::_M_invoke;
  local_38.func.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_AI::WorldState_&,_const_AI::Task_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:1249:4)>
       ::_M_manager;
  std::vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>::
  emplace_back<AI::SatisfiablePredicate>(this,&local_38);
  if (local_38.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_38.func.super__Function_base._M_manager)
              ((_Any_data *)&local_38.func,(_Any_data *)&local_38.func,__destroy_functor);
  }
  local_38.identifier = NearDestination;
  local_38.func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_38.func.super__Function_base._M_functor._8_8_ = 0;
  local_38.func._M_invoker =
       std::
       _Function_handler<bool_(const_AI::WorldState_&,_const_AI::Task_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:1258:4)>
       ::_M_invoke;
  local_38.func.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_AI::WorldState_&,_const_AI::Task_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:1258:4)>
       ::_M_manager;
  std::vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>::
  emplace_back<AI::SatisfiablePredicate>(this,&local_38);
  if (local_38.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_38.func.super__Function_base._M_manager)
              ((_Any_data *)&local_38.func,(_Any_data *)&local_38.func,__destroy_functor);
  }
  local_38.identifier = TimeElapsed;
  local_38.func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_38.func.super__Function_base._M_functor._8_8_ = 0;
  local_38.func._M_invoker =
       std::
       _Function_handler<bool_(const_AI::WorldState_&,_const_AI::Task_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:1293:4)>
       ::_M_invoke;
  local_38.func.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_AI::WorldState_&,_const_AI::Task_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:1293:4)>
       ::_M_manager;
  std::vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>::
  emplace_back<AI::SatisfiablePredicate>(this,&local_38);
  if (local_38.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_38.func.super__Function_base._M_manager)
              ((_Any_data *)&local_38.func,(_Any_data *)&local_38.func,__destroy_functor);
  }
  local_38.identifier = ParameterFlag;
  local_38.func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_38.func.super__Function_base._M_functor._8_8_ = 0;
  local_38.func._M_invoker =
       std::
       _Function_handler<bool_(const_AI::WorldState_&,_const_AI::Task_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:1300:4)>
       ::_M_invoke;
  local_38.func.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_AI::WorldState_&,_const_AI::Task_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:1300:4)>
       ::_M_manager;
  std::vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>::
  emplace_back<AI::SatisfiablePredicate>(this,&local_38);
  if (local_38.func.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_38.func.super__Function_base._M_manager)
              ((_Any_data *)&local_38.func,(_Any_data *)&local_38.func,__destroy_functor);
  }
  return;
}

Assistant:

void setupPredicates(TaskDatabase& tasks)
	{
		//const int numberOfPredicates = 4;
		//tasks.satisfiablePredicates.reserve(numberOfPredicates);

		tasks.satisfiablePredicates.push_back({SatisfiablePredicateIdentifier::NearPlayer,
			[](const WorldState& state, const Task& task, int parameterIndex)
		{
			auto& currentPosition = state.current.vectors.at(WorldStateIdentifier::CurrentPosition);
			auto& destination = state.current.vectors.at(WorldStateIdentifier::PlayerPosition);

			return distanceSquared(currentPosition, destination) < 100000.f;
		}});

		tasks.satisfiablePredicates.push_back({SatisfiablePredicateIdentifier::NearDestination,
			[](const WorldState& state, const Task& task, int parameterIndex)
		{
			auto& currentPosition = state.current.vectors.at(WorldStateIdentifier::CurrentPosition_Feet);
			auto& destination = state.current.vectors.at(WorldStateIdentifier::Destination);

			float minimumDistance = 50000.f;

			if (parameterIndex != -1)
			{
				minimumDistance = task.parameters.vectors[parameterIndex].x;
			}
			
			return distanceSquared(currentPosition, destination) < minimumDistance;
		}});

		/*tasks.satisfiablePredicates.push_back({SatisfiablePredicateIdentifier::NearActor,
			[](const WorldState& state, const Task& task, int parameterIndex)
		{
			auto& currentPosition = state.current.vectors.at(WorldStateIdentifier::CurrentPosition_Feet);

			auto& parameters = task.parameters.vectors[parameterIndex];
			EBlackboardKey blackboardKey {static_cast<EBlackboardKey>(FMath::RoundToInt(parameters.x))};
			auto destination = Cast<Actor>(state.blackboard->GetValueAsObject({*UEnum::GetValueAsString(TEXT("/Script/WoodenSphere.EBlackboardKey"), blackboardKey)}))->GetActorLocation();

			float minimumDistance = 50000.f;

			if (parameterIndex != -1)
			{
				minimumDistance = task.parameters.vectors[parameterIndex].y;
			}
			
			return distanceSquared(currentPosition, destination) < minimumDistance;
		}});*/

		tasks.satisfiablePredicates.push_back({SatisfiablePredicateIdentifier::TimeElapsed,			
			[](const WorldState& state, const Task& task, int parameterIndex)
		{
			auto& parameters = task.parameters.vectors[parameterIndex];
			return parameters.x >= parameters.y;
		}});

		tasks.satisfiablePredicates.push_back({SatisfiablePredicateIdentifier::ParameterFlag,
			[](const WorldState& state, const Task& task, int parameterIndex)
		{
			auto& parameters = task.parameters.vectors[parameterIndex];
			return parameters.x != 0;
		}});

		/*tasks.satisfiablePredicates.push_back({SatisfiablePredicateIdentifier::Blackboard_ValueNotNull,
			[](const WorldState& state, const Task& task, int parameterIndex)
		{
			auto& parameters = task.parameters.vectors[parameterIndex];
			EBlackboardKey blackboardKey {static_cast<EBlackboardKey>(FMath::RoundToInt(parameters.x))};
			return state.blackboard->GetValueAsObject({*UEnum::GetValueAsString(TEXT("/Script/WoodenSphere.EBlackboardKey"), blackboardKey)}) != nullptr;
		}});*/

		/*tasks.satisfiablePredicates.push_back({SatisfiablePredicateIdentifier::ReactionFinished,
			[](const WorldState& state, const Task& task, int parameterIndex)
		{
			auto& parameters = task.parameters.vectors[parameterIndex];
			return state.animationDriver->reactionDriver->tracker->getRequestId() == FMath::RoundToInt(parameters.x)
				&& state.animationDriver->reactionDriver->tracker->reactionHasFinished();
		}});*/

	}